

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::AggregateStateTypeInfo::Deserialize(AggregateStateTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  AggregateStateTypeInfo *pAVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  shared_ptr<duckdb::AggregateStateTypeInfo,_true> result;
  shared_ptr<duckdb::AggregateStateTypeInfo,_true> local_38;
  
  pAVar2 = (AggregateStateTypeInfo *)operator_new(0x88);
  AggregateStateTypeInfo(pAVar2);
  ::std::__shared_ptr<duckdb::AggregateStateTypeInfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::AggregateStateTypeInfo,void>
            ((__shared_ptr<duckdb::AggregateStateTypeInfo,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             pAVar2);
  pAVar2 = shared_ptr<duckdb::AggregateStateTypeInfo,_true>::operator->(&local_38);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"function_name",&(pAVar2->state_type).function_name);
  pAVar2 = shared_ptr<duckdb::AggregateStateTypeInfo,_true>::operator->(&local_38);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,0xc9,"return_type",&(pAVar2->state_type).return_type);
  pAVar2 = shared_ptr<duckdb::AggregateStateTypeInfo,_true>::operator->(&local_38);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xca,"bound_argument_types",&(pAVar2->state_type).bound_argument_types);
  _Var1._M_pi = local_38.internal.
                super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_38.internal.super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_38.internal.
       super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  local_38.internal.super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.internal.
              super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> AggregateStateTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<AggregateStateTypeInfo>(new AggregateStateTypeInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "function_name", result->state_type.function_name);
	deserializer.ReadProperty<LogicalType>(201, "return_type", result->state_type.return_type);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(202, "bound_argument_types", result->state_type.bound_argument_types);
	return std::move(result);
}